

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O2

int __thiscall
RenX_RelayPlugin::send_downstream
          (RenX_RelayPlugin *this,Server *in_server,string_view in_message,
          upstream_server_info *in_server_info)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  string sStack_248;
  ofstream log_file;
  byte abStack_208 [480];
  
  if (in_server_info->m_settings->m_log_traffic == true) {
    get_log_filename_abi_cxx11_(&sStack_248,(RenX_RelayPlugin *)in_server,in_server,in_server_info);
    std::ofstream::ofstream(&log_file,(string *)&sStack_248,_S_out|_S_bin|_S_app);
    std::__cxx11::string::~string((string *)&sStack_248);
    if ((abStack_208[*(long *)(_log_file + -0x18)] & 5) == 0) {
      poVar2 = std::operator<<((ostream *)&log_file,'[');
      pcVar3 = (char *)getTimeFormat("%H:%M:%S");
      poVar2 = std::operator<<(poVar2,pcVar3);
      poVar2 = std::operator<<(poVar2,"] (");
      poVar2 = std::operator<<(poVar2,(string *)in_server_info->m_settings);
      poVar2 = std::operator<<(poVar2," -> RenX::Server): ");
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,in_message._M_str,in_message._M_len);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::ofstream::~ofstream(&log_file);
  }
  iVar1 = RenX::Server::sendData(in_server,in_message._M_len,in_message._M_str);
  return iVar1;
}

Assistant:

int RenX_RelayPlugin::send_downstream(RenX::Server& in_server, std::string_view in_message, upstream_server_info& in_server_info) {
	if (in_server_info.m_settings->m_log_traffic) {
		std::ofstream log_file{ get_log_filename(in_server, in_server_info), std::ios::out | std::ios::app | std::ios::binary };
		if (log_file) {
			log_file << '[' << getTimeFormat("%H:%M:%S") << "] (" << in_server_info.m_settings->m_label << " -> RenX::Server): " << in_message << std::endl;
		}
	}

	return in_server.sendData(in_message);
}